

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

int __thiscall QFSFileEngine::rmdir(QFSFileEngine *this,char *__path)

{
  bool bVar1;
  undefined7 extraout_var;
  bool in_DL;
  long in_FS_OFFSET;
  QFileSystemEntry local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry::QFileSystemEntry(&local_50,(QString *)__path);
  bVar1 = QFileSystemEngine::removeDirectory(&local_50,in_DL);
  QFileSystemEntry::~QFileSystemEntry(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::rmdir(const QString &name, bool recurseParentDirectories) const
{
    return QFileSystemEngine::removeDirectory(QFileSystemEntry(name), recurseParentDirectories);
}